

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_flat_map.hpp
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>,_bool>
 __thiscall
chaiscript::utility::
QuickFlatMap<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,chaiscript::str_equal>
::insert_or_assign<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
          (QuickFlatMap<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,chaiscript::str_equal>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *m)

{
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
  __r;
  bool bVar1;
  pointer ppVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>,_bool>
  pVar4;
  bool local_61;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
  local_60;
  const_iterator local_58;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
  local_50;
  bool local_41;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
  local_40;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
  local_38;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
  itr;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *m_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_chaiscript::str_equal>
  *this_local;
  bool local_10;
  
  itr._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>
        *)m;
  local_38 = find<std::__cxx11::string>(this,key);
  local_40._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
          ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                 *)(this + 8));
  bVar1 = __gnu_cxx::
          operator==<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
                    (&local_38,&local_40);
  __r = itr;
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_chaiscript::str_equal>
    ::grow((QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_chaiscript::str_equal>
            *)this);
    local_60._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
            ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                   *)(this + 8));
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>const*,std::vector<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>>
    ::
    __normal_iterator<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>*>
              ((__normal_iterator<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>const*,std::vector<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>>
                *)&local_58,&local_60);
    local_50._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>
          *)std::
            vector<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
            ::
            emplace<std::__cxx11::string_const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
                      ((vector<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
                        *)(this + 8),local_58,key,itr._M_current);
    local_61 = true;
    std::
    pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>,_bool>
    ::
    pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>,_bool,_true>
              ((pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>,_bool>
                *)&this_local,&local_50,&local_61);
    uVar3 = extraout_RDX_00;
  }
  else {
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
             ::operator->(&local_38);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::operator=
              (&ppVar2->second,
               (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)__r._M_current);
    local_41 = false;
    std::
    pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>,_bool>
    ::
    pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>_&,_bool,_true>
              ((pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>,_bool>
                *)&this_local,&local_38,&local_41);
    uVar3 = extraout_RDX;
  }
  pVar4._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  pVar4.second = local_10;
  pVar4.first._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>
        *)this_local;
  return pVar4;
}

Assistant:

auto insert_or_assign(const Key &key, M &&m) {
      if (auto itr = find(key); itr != data.end()) {
        itr->second = std::forward<M>(m);
        return std::pair{itr, false};
      } else {
        grow();
        return std::pair{data.emplace(data.end(), key, std::forward<M>(m)), true};
      }
    }